

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFLTKWrapUICommand.cxx
# Opt level: O3

bool cmFLTKWrapUICommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *args,cmExecutionStatus *status)

{
  cmMakefile *this;
  pointer pcVar1;
  _Head_base<0UL,_cmCustomCommand_*,_false> _Var2;
  pointer pbVar3;
  bool bVar4;
  string *psVar5;
  cmSourceFile *this_00;
  cmCustomCommand *this_01;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  string_view value;
  __single_object hcc;
  string sourceListValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputDirectories;
  __single_object ccc;
  string cxxres;
  string varName;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> generatedSourcesClasses;
  string cdir;
  string outName;
  string outputDirectory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLines commandLines;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_270;
  undefined1 local_268 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 local_238 [16];
  _Alloc_hider local_228;
  char *pcStack_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  char *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  __buckets_ptr local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_1d0;
  string local_1c8;
  string local_1a8;
  _Alloc_hider local_188;
  iterator iStack_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  pointer local_128;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_120;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_118;
  pointer local_110;
  value_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  ulong local_90;
  pointer local_88;
  pointer local_80;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_78;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  uVar12 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  if (uVar12 < 0x21) {
    local_248._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_238;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_158._M_allocated_capacity = local_238._0_8_;
    uVar9 = local_248._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_allocated_capacity ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238) goto LAB_002ae4b4;
  }
  else {
    this = status->Makefile;
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
    local_168._M_p = (pointer)&local_158;
    pcVar1 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,pcVar1,pcVar1 + psVar5->_M_string_length);
    local_248._M_allocated_capacity = (size_type)local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"FLTK_FLUID_EXECUTABLE","")
    ;
    local_110 = (pointer)cmMakefile::GetRequiredDefinition(this,(string *)&local_248);
    if ((undefined1 *)local_248._M_allocated_capacity != local_238) {
      operator_delete((void *)local_248._M_allocated_capacity,(ulong)(local_238._0_8_ + 1));
    }
    local_88 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    pcVar1 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,pcVar1,pcVar1 + psVar5->_M_string_length);
    local_248._M_allocated_capacity = 0;
    local_248._8_8_ = 0;
    local_238._0_8_ = (cmMakefile *)0x0;
    local_90 = uVar12;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_248,&local_108);
    cmMakefile::AddIncludeDirectories
              (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_248,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_248);
    local_188._M_p = (pointer)0x0;
    iStack_180._M_current = (cmSourceFile **)0x0;
    local_178._M_allocated_capacity = 0;
    local_80 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    psVar5 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1;
    if (psVar5 == local_80) {
      local_268._0_8_ = local_268 + 0x10;
      local_268._8_8_ = (code *)0x0;
      local_268[0x10] = '\0';
      local_128 = (pointer)local_268._0_8_;
    }
    else {
      local_128 = (pointer)(local_268 + 0x10);
      do {
        this_00 = cmMakefile::GetSource(this,psVar5,Ambiguous);
        if (this_00 == (cmSourceFile *)0x0) {
LAB_002adb8e:
          cmsys::SystemTools::GetFilenameWithoutExtension((string *)local_268,psVar5);
          local_248._M_allocated_capacity = local_108._M_string_length;
          local_248._8_8_ = local_108._M_dataplus._M_p;
          local_238._0_8_ = (cmMakefile *)0x0;
          local_238[8] = true;
          local_238[9] = false;
          local_238._10_6_ = 0;
          local_228._M_p = "/";
          pcStack_220 = (char *)0x0;
          local_218._M_allocated_capacity = local_268._8_8_;
          local_218._8_8_ = local_268._0_8_;
          views._M_len = 3;
          views._M_array = (iterator)&local_248;
          local_208._M_p = (pointer)local_268;
          cmCatViews((string *)&local_148,views);
          if ((pointer)local_268._0_8_ != (pointer)(local_268 + 0x10)) {
            operator_delete((void *)local_268._0_8_,CONCAT71(local_268._17_7_,local_268[0x10]) + 1);
          }
          local_248._M_allocated_capacity = local_148._8_8_;
          local_248._8_8_ = local_148._M_allocated_capacity;
          local_238._0_8_ = (cmMakefile *)0x0;
          local_238[8] = true;
          local_238[9] = false;
          local_238._10_6_ = 0;
          local_228._M_p = ".h";
          pcStack_220 = (char *)0x0;
          views_00._M_len = 2;
          views_00._M_array = (iterator)&local_248;
          cmCatViews((string *)local_268,views_00);
          local_248._M_allocated_capacity = local_160;
          local_248._8_8_ = local_168._M_p;
          local_238._0_8_ = (cmMakefile *)0x0;
          local_238[8] = true;
          local_238[9] = false;
          local_238._10_6_ = 0;
          local_228._M_p = "/";
          pcStack_220 = (char *)0x0;
          local_218._8_8_ = (psVar5->_M_dataplus)._M_p;
          local_218._M_allocated_capacity = psVar5->_M_string_length;
          local_208._M_p = (pointer)0x0;
          views_01._M_len = 3;
          views_01._M_array = (iterator)&local_248;
          cmCatViews(&local_1a8,views_01);
          local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_a8,&local_1a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_a8,&local_110->Value);
          local_248._M_allocated_capacity = local_148._8_8_;
          local_248._8_8_ = local_148._M_allocated_capacity;
          local_238._0_8_ = (cmMakefile *)0x0;
          local_238[8] = true;
          local_238[9] = false;
          local_238._10_6_ = 0;
          local_228._M_p = ".cxx";
          pcStack_220 = (char *)0x0;
          views_02._M_len = 2;
          views_02._M_array = (iterator)&local_248;
          cmCatViews(&local_1c8,views_02);
          local_248._8_8_ = (local_110->Value)._M_dataplus._M_p;
          local_248._M_allocated_capacity = (local_110->Value)._M_string_length;
          local_238._0_8_ = (cmMakefile *)0x2;
          local_238._8_8_ = (long)"linux-c" + 5;
          local_228._M_p = (pointer)0x2;
          pcStack_220 = "-h";
          local_218._M_allocated_capacity = local_268._8_8_;
          local_218._8_8_ = local_268._0_8_;
          local_208._M_p = (pointer)0x2;
          local_200 = "-o";
          local_1f8._M_allocated_capacity = local_1c8._M_string_length;
          local_1f8._8_8_ = local_1c8._M_dataplus._M_p;
          local_1e8 = (__buckets_ptr)local_1a8._M_string_length;
          local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1a8._M_dataplus._M_p;
          ilist._M_len = 7;
          ilist._M_array = (iterator)&local_248;
          cmMakeSingleCommandLine((cmCustomCommandLines *)&local_78,ilist);
          std::make_unique<cmCustomCommand>();
          _Var2._M_head_impl = local_270._M_head_impl;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,&local_a8);
          cmCustomCommand::SetDepends(_Var2._M_head_impl,&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          _Var2._M_head_impl = local_270._M_head_impl;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                    (&local_60,&local_78);
          cmCustomCommand::SetCommandLines(_Var2._M_head_impl,(cmCustomCommandLines *)&local_60);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_60)
          ;
          _Var2._M_head_impl = local_270._M_head_impl;
          this_01 = (cmCustomCommand *)operator_new(0x140);
          cmCustomCommand::cmCustomCommand(this_01,_Var2._M_head_impl);
          _Var2._M_head_impl = local_270._M_head_impl;
          local_c8._M_allocated_capacity = (size_type)&local_b8;
          local_1d0._M_head_impl = this_01;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,local_1c8._M_dataplus._M_p,
                     local_1c8._M_dataplus._M_p + local_1c8._M_string_length);
          cmCustomCommand::SetOutputs(_Var2._M_head_impl,(string *)&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_allocated_capacity != &local_b8) {
            operator_delete((void *)local_c8._M_allocated_capacity,
                            local_b8._M_allocated_capacity + 1);
          }
          local_118._M_head_impl = local_270._M_head_impl;
          local_270._M_head_impl = (cmCustomCommand *)0x0;
          local_238._0_8_ = (cmMakefile *)0x0;
          local_238[8] = false;
          local_238[9] = false;
          local_238._10_6_ = 0;
          local_248._M_allocated_capacity = 0;
          local_248._8_8_ = 0;
          cmMakefile::AddCustomCommandToOutput
                    (this,(unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                          &local_118,(CommandSourceCallback *)&local_248,false);
          if ((cmMakefile *)local_238._0_8_ != (cmMakefile *)0x0) {
            (*(code *)local_238._0_8_)(&local_248,&local_248,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_118);
          _Var2._M_head_impl = local_1d0._M_head_impl;
          local_e8._M_allocated_capacity = (size_type)&local_d8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,local_268._0_8_,(code *)(local_268._8_8_ + local_268._0_8_)
                    );
          cmCustomCommand::SetOutputs(_Var2._M_head_impl,(string *)&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_allocated_capacity != &local_d8) {
            operator_delete((void *)local_e8._M_allocated_capacity,
                            (ulong)(local_d8._M_allocated_capacity + 1));
          }
          local_120._M_head_impl = local_1d0._M_head_impl;
          local_1d0._M_head_impl = (cmCustomCommand *)0x0;
          local_238._0_8_ = (cmMakefile *)0x0;
          local_238._8_8_ = (code *)0x0;
          local_248._M_allocated_capacity = 0;
          local_248._8_8_ = 0;
          cmMakefile::AddCustomCommandToOutput
                    (this,(unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                          &local_120,(CommandSourceCallback *)&local_248,false);
          if ((cmMakefile *)local_238._0_8_ != (cmMakefile *)0x0) {
            (*(code *)local_238._0_8_)(&local_248,&local_248,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_120);
          local_248._M_allocated_capacity =
               (size_type)cmMakefile::GetSource(this,&local_1c8,Ambiguous);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&((cmSourceFile *)local_248._M_allocated_capacity)->Depends,
                      (value_type *)local_268);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_248._M_allocated_capacity + 0x110),&local_1a8);
          if (iStack_180._M_current == (cmSourceFile **)local_178._M_allocated_capacity) {
            std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
            _M_realloc_insert<cmSourceFile*const&>
                      ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)&local_188,iStack_180,
                       (cmSourceFile **)&local_248._M_allocated_capacity);
          }
          else {
            *iStack_180._M_current = (cmSourceFile *)local_248._M_allocated_capacity;
            iStack_180._M_current = iStack_180._M_current + 1;
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_1d0);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_270);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_78)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,
                            (ulong)(local_1c8.field_2._M_allocated_capacity + 1));
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if ((pointer)local_268._0_8_ != (pointer)(local_268 + 0x10)) {
            operator_delete((void *)local_268._0_8_,CONCAT71(local_268._17_7_,local_268[0x10]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_allocated_capacity != &local_138) {
            operator_delete((void *)local_148._M_allocated_capacity,
                            (ulong)(local_138._M_allocated_capacity + 1));
          }
        }
        else {
          local_248._M_allocated_capacity = (size_type)local_238;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"WRAP_EXCLUDE","");
          bVar4 = cmSourceFile::GetPropertyAsBool(this_00,(string *)&local_248);
          if ((cmSourceFile *)local_248._M_allocated_capacity != (cmSourceFile *)local_238) {
            operator_delete((void *)local_248._M_allocated_capacity,(ulong)(local_238._0_8_ + 1));
          }
          if (!bVar4) goto LAB_002adb8e;
        }
        psVar5 = psVar5 + 1;
      } while (psVar5 != local_80);
      local_268._0_8_ = local_268 + 0x10;
      local_268._8_8_ = (code *)0x0;
      local_268[0x10] = '\0';
      if ((long)iStack_180._M_current - (long)local_188._M_p != 0) {
        lVar10 = (long)iStack_180._M_current - (long)local_188._M_p >> 3;
        lVar11 = 0;
        lVar8 = 0;
        do {
          _Var6._M_p = local_188._M_p;
          if (lVar8 != 0) {
            std::__cxx11::string::append(local_268);
            _Var6._M_p = local_188._M_p + lVar11;
          }
          psVar5 = cmSourceFile::ResolveFullPath
                             (*(cmSourceFile **)_Var6._M_p,(string *)0x0,(string *)0x0);
          std::__cxx11::string::_M_append(local_268,(ulong)(psVar5->_M_dataplus)._M_p);
          lVar8 = lVar8 + 1;
          lVar11 = lVar11 + 8;
        } while (lVar10 + (ulong)(lVar10 == 0) != lVar8);
      }
    }
    pbVar3 = local_88;
    pcVar1 = (local_88->_M_dataplus)._M_p;
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,pcVar1,pcVar1 + local_88->_M_string_length);
    std::__cxx11::string::append((char *)&local_1a8);
    value._M_str = (char *)local_268._0_8_;
    value._M_len = local_268._8_8_;
    cmMakefile::AddDefinition(this,&local_1a8,value);
    pcVar1 = (pbVar3->_M_dataplus)._M_p;
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,pcVar1,pcVar1 + pbVar3->_M_string_length);
    _Var6._M_p = local_1c8._M_dataplus._M_p;
    local_148._8_8_ = 0;
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)operator_new(0x20);
    paVar7->_M_allocated_capacity = (size_type)(paVar7->_M_local_buf + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)paVar7,_Var6._M_p,_Var6._M_p + local_1c8._M_string_length);
    local_238._8_8_ =
         std::
         _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFLTKWrapUICommand.cxx:134:5)>
         ::_M_invoke;
    local_248._8_8_ = local_148._8_8_;
    local_238._0_8_ =
         std::
         _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFLTKWrapUICommand.cxx:134:5)>
         ::_M_manager;
    local_138._M_allocated_capacity = 0;
    local_138._8_8_ = 0;
    local_218._M_allocated_capacity = 0;
    local_218._8_8_ = (char *)0x0;
    local_228._M_p = (pointer)0x0;
    pcStack_220 = (char *)0x0;
    local_208._M_p = (pointer)0x0;
    local_248._M_allocated_capacity = (size_type)paVar7;
    local_148._M_allocated_capacity = (size_type)paVar7;
    cmMakefile::AddGeneratorAction(this,(GeneratorAction *)&local_248);
    uVar12 = local_90;
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_208);
    if ((code *)local_218._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_218._M_allocated_capacity)(&local_228,&local_228,3);
    }
    if ((cmMakefile *)local_238._0_8_ != (cmMakefile *)0x0) {
      (*(code *)local_238._0_8_)(&local_248,&local_248,3);
    }
    if ((code *)local_138._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_138._M_allocated_capacity)(&local_148,&local_148,3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,
                      (ulong)(local_1c8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_268._0_8_ != local_128) {
      operator_delete((void *)local_268._0_8_,CONCAT71(local_268._17_7_,local_268[0x10]) + 1);
    }
    if (local_188._M_p != (pointer)0x0) {
      operator_delete(local_188._M_p,local_178._M_allocated_capacity - (long)local_188._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    uVar9 = local_168._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_p == &local_158) goto LAB_002ae4b4;
  }
  operator_delete((void *)uVar9,
                  (ulong)((long)&(((cmMakefile *)local_158._M_allocated_capacity)->
                                 FindPackageRootPathStack).
                                 super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_map + 1));
LAB_002ae4b4:
  return 0x20 < uVar12;
}

Assistant:

bool cmFLTKWrapUICommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // what is the current source dir
  std::string cdir = mf.GetCurrentSourceDirectory();
  std::string const& fluid_exe =
    mf.GetRequiredDefinition("FLTK_FLUID_EXECUTABLE");

  // Target that will use the generated files
  std::string const& target = args[0];

  // get the list of GUI files from which .cxx and .h will be generated
  std::string outputDirectory = mf.GetCurrentBinaryDirectory();

  {
    // Some of the generated files are *.h so the directory "GUI"
    // where they are created have to be added to the include path
    std::vector<std::string> outputDirectories;
    outputDirectories.push_back(outputDirectory);
    mf.AddIncludeDirectories(outputDirectories);
  }

  // List of produced files.
  std::vector<cmSourceFile*> generatedSourcesClasses;

  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    cmSourceFile* curr = mf.GetSource(arg);
    // if we should use the source GUI
    // to generate .cxx and .h files
    if (!curr || !curr->GetPropertyAsBool("WRAP_EXCLUDE")) {
      std::string outName = cmStrCat(
        outputDirectory, "/", cmSystemTools::GetFilenameWithoutExtension(arg));
      std::string hname = cmStrCat(outName, ".h");
      std::string origname = cmStrCat(cdir, "/", arg);
      // add starting depends
      std::vector<std::string> depends;
      depends.push_back(origname);
      depends.push_back(fluid_exe);
      std::string cxxres = cmStrCat(outName, ".cxx");

      cmCustomCommandLines commandLines = cmMakeSingleCommandLine({
        fluid_exe,
        "-c", // instructs Fluid to run in command line
        "-h", // optionally rename .h files
        hname,
        "-o", // optionally rename .cxx files
        cxxres,
        origname // name of the GUI fluid file
      });

      // Add command for generating the .h and .cxx files

      auto hcc = cm::make_unique<cmCustomCommand>();
      hcc->SetDepends(depends);
      hcc->SetCommandLines(commandLines);
      auto ccc = cm::make_unique<cmCustomCommand>(*hcc);

      hcc->SetOutputs(cxxres);
      mf.AddCustomCommandToOutput(std::move(hcc));

      ccc->SetOutputs(hname);
      mf.AddCustomCommandToOutput(std::move(ccc));

      cmSourceFile* sf = mf.GetSource(cxxres);
      sf->AddDepend(hname);
      sf->AddDepend(origname);
      generatedSourcesClasses.push_back(sf);
    }
  }

  // create the variable with the list of sources in it
  size_t lastHeadersClass = generatedSourcesClasses.size();
  std::string sourceListValue;
  for (size_t classNum = 0; classNum < lastHeadersClass; classNum++) {
    if (classNum) {
      sourceListValue += ";";
    }
    sourceListValue += generatedSourcesClasses[classNum]->ResolveFullPath();
  }

  std::string const varName = target + "_FLTK_UI_SRCS";
  mf.AddDefinition(varName, sourceListValue);

  mf.AddGeneratorAction(
    [target](cmLocalGenerator& lg, const cmListFileBacktrace& lfbt) {
      FinalAction(*lg.GetMakefile(), target, lfbt);
    });
  return true;
}